

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

int mbedtls_sha512_self_test(int verbose)

{
  uint is384;
  int iVar1;
  undefined1 local_540 [8];
  mbedtls_sha512_context ctx;
  uchar sha512sum [64];
  uchar buf [1024];
  int local_20;
  int ret;
  int buflen;
  int k;
  int j;
  int i;
  int verbose_local;
  
  local_20 = 0;
  mbedtls_sha512_init((mbedtls_sha512_context *)local_540);
  k = 0;
  do {
    if (5 < k) {
      if (verbose != 0) {
        printf(anon_var_dwarf_d1450 + 8);
      }
LAB_00177b76:
      mbedtls_sha512_free((mbedtls_sha512_context *)local_540);
      return local_20;
    }
    iVar1 = k % 3;
    is384 = (uint)(k < 3);
    if (verbose != 0) {
      printf("  SHA-%d test #%d: ",(ulong)(is384 * -0x80 + 0x200),(ulong)(iVar1 + 1));
    }
    mbedtls_sha512_starts((mbedtls_sha512_context *)local_540,is384);
    if (iVar1 == 2) {
      memset(sha512sum + 0x38,0x61,1000);
      for (buflen = 0; buflen < 1000; buflen = buflen + 1) {
        mbedtls_sha512_update((mbedtls_sha512_context *)local_540,sha512sum + 0x38,1000);
      }
    }
    else {
      mbedtls_sha512_update
                ((mbedtls_sha512_context *)local_540,sha512_test_buf[iVar1],
                 (long)sha512_test_buflen[iVar1]);
    }
    mbedtls_sha512_finish((mbedtls_sha512_context *)local_540,(uchar *)&ctx.is384);
    iVar1 = memcmp(&ctx.is384,sha512_test_sum + k,(long)(int)(is384 * -0x10 + 0x40));
    if (iVar1 != 0) {
      if (verbose != 0) {
        printf("failed\n");
      }
      local_20 = 1;
      goto LAB_00177b76;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    k = k + 1;
  } while( true );
}

Assistant:

int mbedtls_sha512_self_test( int verbose )
{
    int i, j, k, buflen, ret = 0;
    unsigned char buf[1024];
    unsigned char sha512sum[64];
    mbedtls_sha512_context ctx;

    mbedtls_sha512_init( &ctx );

    for( i = 0; i < 6; i++ )
    {
        j = i % 3;
        k = i < 3;

        if( verbose != 0 )
            mbedtls_printf( "  SHA-%d test #%d: ", 512 - k * 128, j + 1 );

        mbedtls_sha512_starts( &ctx, k );

        if( j == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
                mbedtls_sha512_update( &ctx, buf, buflen );
        }
        else
            mbedtls_sha512_update( &ctx, sha512_test_buf[j],
                                 sha512_test_buflen[j] );

        mbedtls_sha512_finish( &ctx, sha512sum );

        if( memcmp( sha512sum, sha512_test_sum[i], 64 - k * 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_sha512_free( &ctx );

    return( ret );
}